

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O2

void __thiscall estl::state_machine<cdplayer>::state_machine(state_machine<cdplayer> *this)

{
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[0].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->state_switches_)._M_elems[0].switch_conditions_m.state_machine_m =
       (state_machine_type *)0x0;
  (this->state_switches_)._M_elems[0].switch_conditions_m.conditions_m.
  super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[0].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (this->state_switches_)._M_elems[0].user_do_switch_function_m.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->state_switches_)._M_elems[0].user_do_switch_function_m._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->state_switches_)._M_elems[0].user_do_switch_function_m.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(this->state_switches_)._M_elems[0].user_do_switch_function_m.super__Function_base.
           _M_functor + 8) = 0;
  *(undefined8 *)
   &(this->state_switches_)._M_elems[1].user_do_switch_function_m.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(this->state_switches_)._M_elems[1].user_do_switch_function_m.super__Function_base.
           _M_functor + 8) = 0;
  (this->state_switches_)._M_elems[1].user_do_switch_function_m.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->state_switches_)._M_elems[1].user_do_switch_function_m._M_invoker = (_Invoker_type)0x0;
  (this->state_switches_)._M_elems[1].switch_conditions_m.conditions_m.
  super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[1].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[1].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->state_switches_)._M_elems[1].switch_conditions_m.state_machine_m =
       (state_machine_type *)0x0;
  *(undefined8 *)
   &(this->state_switches_)._M_elems[2].user_do_switch_function_m.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(this->state_switches_)._M_elems[2].user_do_switch_function_m.super__Function_base.
           _M_functor + 8) = 0;
  (this->state_switches_)._M_elems[2].user_do_switch_function_m.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->state_switches_)._M_elems[2].user_do_switch_function_m._M_invoker = (_Invoker_type)0x0;
  (this->state_switches_)._M_elems[2].switch_conditions_m.conditions_m.
  super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[2].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[2].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->state_switches_)._M_elems[2].switch_conditions_m.state_machine_m =
       (state_machine_type *)0x0;
  *(undefined8 *)
   &(this->state_switches_)._M_elems[3].user_do_switch_function_m.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(this->state_switches_)._M_elems[3].user_do_switch_function_m.super__Function_base.
           _M_functor + 8) = 0;
  (this->state_switches_)._M_elems[3].user_do_switch_function_m.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->state_switches_)._M_elems[3].user_do_switch_function_m._M_invoker = (_Invoker_type)0x0;
  (this->state_switches_)._M_elems[3].switch_conditions_m.conditions_m.
  super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[3].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->state_switches_)._M_elems[3].switch_conditions_m.conditions_m.
           super__Vector_base<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->state_switches_)._M_elems[3].switch_conditions_m.state_machine_m =
       (state_machine_type *)0x0;
  *(undefined8 *)
   ((long)&(this->actions_).
           super__Vector_base<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->actions_).
           super__Vector_base<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->actions_).
  super__Vector_base<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actions_).
  super__Vector_base<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputs_).pwr_light = active;
  cdplayer::add_transitions((cdplayer *)this,this);
  cdplayer::add_actions((cdplayer *)this,this);
  return;
}

Assistant:

state_machine() {
        state_machine_.add_transitions(*this);
        state_machine_.add_actions(*this);
    }